

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aGen.hpp
# Opt level: O0

ByteCode * __thiscall
ag::Generator::FunctionManager::Get(ByteCode *__return_storage_ptr__,FunctionManager *this,size_t i)

{
  size_t sVar1;
  unsigned_long uVar2;
  ulong uVar3;
  reference pvVar4;
  reference pvVar5;
  reference this_00;
  size_t sVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  ulong local_40;
  size_t j;
  size_type local_20;
  size_t i_local;
  FunctionManager *this_local;
  
  local_20 = i;
  i_local = (size_t)this;
  this_local = (FunctionManager *)__return_storage_ptr__;
  pvVar4 = std::vector<ag::ByteCode,_std::allocator<ag::ByteCode>_>::operator[](&this->m_code,i);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_lengthAddr,local_20);
  sVar1 = *pvVar5;
  this_00 = std::vector<ag::ByteCode,_std::allocator<ag::ByteCode>_>::operator[]
                      (&this->m_code,local_20);
  sVar6 = ByteCode::Count(this_00);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->m_lengthAddr,local_20);
  BitConverter::GetUInt32
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j,
             (int)sVar6 - ((int)*pvVar5 + 4));
  ByteCode::Write(pvVar4,sVar1,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&j);
  local_40 = 0;
  while( true ) {
    uVar3 = local_40;
    pvVar7 = std::
             vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
             ::operator[](&this->m_linkAddr,local_20);
    sVar8 = std::
            vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ::size(pvVar7);
    if (sVar8 <= uVar3) break;
    pvVar4 = std::vector<ag::ByteCode,_std::allocator<ag::ByteCode>_>::operator[]
                       (&this->m_code,local_20);
    pvVar7 = std::
             vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
             ::operator[](&this->m_linkAddr,local_20);
    pvVar9 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator[](pvVar7,local_40);
    sVar1 = pvVar9->first;
    pvVar7 = std::
             vector<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>,_std::allocator<std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>
             ::operator[](&this->m_linkAddr,local_20);
    pvVar9 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::operator[](pvVar7,local_40);
    uVar2 = pvVar9->second;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_lengthAddr,local_20);
    BitConverter::GetUInt32(&local_58,(int)uVar2 - ((int)*pvVar5 + 4));
    ByteCode::Write(pvVar4,sVar1,&local_58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_58);
    local_40 = local_40 + 1;
  }
  pvVar4 = std::vector<ag::ByteCode,_std::allocator<ag::ByteCode>_>::operator[]
                     (&this->m_code,local_20);
  ByteCode::ByteCode(__return_storage_ptr__,pvVar4);
  return __return_storage_ptr__;
}

Assistant:

inline ByteCode Get(size_t i)
			{
				m_code[i].Write(m_lengthAddr[i],
					BitConverter::GetUInt32(
						m_code[i].Count() - (m_lengthAddr[i] + sizeof(uint32_t))
					)
				);

				for (size_t j = 0; j < m_linkAddr[i].size(); j++)
					m_code[i].Write(m_linkAddr[i][j].first,
						BitConverter::GetUInt32(
							m_linkAddr[i][j].second - (m_lengthAddr[i] + sizeof(uint32_t))
						)
					);

				return m_code[i];
			}